

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_rcm(REF_EDGE ref_edge,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_NODE pRVar3;
  bool bVar4;
  uint uVar5;
  REF_INT *pRVar6;
  uint uVar7;
  REF_INT *o2n;
  long lVar8;
  REF_INT *queue;
  ulong uVar9;
  REF_INT *pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  char *pcVar13;
  REF_EDGE ref_edge_00;
  REF_INT nqueue;
  REF_INT ndone;
  REF_INT degree;
  uint local_74;
  int local_70;
  REF_INT local_6c;
  uint local_68;
  int local_64;
  uint local_60;
  int local_5c;
  REF_INT *local_58;
  REF_EDGE local_50;
  REF_INT **local_48;
  REF_INT **local_40;
  REF_ADJ local_38;
  
  pRVar2 = ref_edge->node;
  *o2n_ptr = (REF_INT *)0x0;
  *n2o_ptr = (REF_INT *)0x0;
  local_50 = ref_edge;
  if ((long)pRVar2->max < 0) {
    local_74 = 1;
    pcVar13 = "malloc o2n of REF_INT negative";
  }
  else {
    o2n = (REF_INT *)malloc((long)pRVar2->max << 2);
    if (o2n != (REF_INT *)0x0) {
      bVar4 = true;
      if (0 < pRVar2->max) {
        lVar8 = 0;
        do {
          o2n[lVar8] = -1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pRVar2->max);
      }
      goto LAB_00116eb5;
    }
    local_74 = 2;
    pcVar13 = "malloc o2n of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x31b,
         "ref_edge_rcm",pcVar13);
  o2n = (REF_INT *)0x0;
LAB_00116eb5:
  if (bVar4) {
    iVar1 = pRVar2->n;
    if ((long)iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x31c,
             "ref_edge_rcm","malloc n2o of REF_INT negative");
      local_74 = 1;
    }
    else {
      local_58 = (REF_INT *)malloc((long)iVar1 * 4);
      if (local_58 == (REF_INT *)0x0) {
        pcVar13 = "malloc n2o of REF_INT NULL";
        uVar11 = 0x31c;
      }
      else {
        local_48 = o2n_ptr;
        local_40 = n2o_ptr;
        queue = (REF_INT *)malloc((ulong)(uint)(iVar1 * 2) << 2);
        if (queue != (REF_INT *)0x0) {
          local_68 = 0;
          local_6c = 0;
          uVar7 = pRVar2->n;
          ref_edge_00 = local_50;
          if ((int)uVar7 < 1) {
LAB_00117128:
            pRVar6 = local_58;
            uVar5 = local_68;
            if (local_68 == uVar7) {
              uVar12 = (ulong)local_68;
              uVar9 = uVar12;
              pRVar10 = local_58;
              if (0 < (int)local_68) {
                do {
                  queue[uVar9 - 1] = *pRVar10;
                  uVar9 = uVar9 - 1;
                  pRVar10 = pRVar10 + 1;
                } while (uVar9 != 0);
              }
              if (0 < (int)local_68) {
                memcpy(local_58,queue,uVar12 * 4);
              }
              free(queue);
              if (0 < (int)uVar5) {
                uVar9 = 0;
                do {
                  o2n[pRVar6[uVar9]] = (REF_INT)uVar9;
                  uVar9 = uVar9 + 1;
                } while (uVar12 != uVar9);
              }
              *local_48 = o2n;
              *local_40 = pRVar6;
              return 0;
            }
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   0x334,"ref_edge_rcm","reordering done not original nodes",(long)(int)local_68,
                   (long)(int)uVar7);
            return 1;
          }
LAB_00116f28:
          pRVar3 = ref_edge_00->node;
          if (pRVar3->max < 1) {
            local_70 = -1;
            uVar7 = 0;
          }
          else {
            local_38 = ref_edge_00->adj;
            local_64 = -1;
            local_70 = -1;
            lVar8 = 0;
            do {
              if ((-1 < pRVar3->global[lVar8]) && (o2n[lVar8] == -1)) {
                uVar7 = ref_adj_degree(local_38,(REF_INT)lVar8,&local_5c);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x2be,"ref_edge_min_degree_node",(ulong)uVar7,"deg");
                  local_60 = uVar7;
                  goto LAB_00117012;
                }
                if ((0 < local_5c) && (local_5c < local_64 || local_70 == -1)) {
                  local_70 = (REF_INT)lVar8;
                  local_64 = local_5c;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pRVar3->max);
            uVar7 = 0;
          }
LAB_00117012:
          ref_edge_00 = local_50;
          pRVar6 = local_58;
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   0x324,"ref_edge_rcm",(ulong)uVar7,"min degree node");
            return uVar7;
          }
          uVar7 = ref_edge_rcm_queue(local_50,local_70,o2n,local_58,(REF_INT *)&local_68,queue,
                                     &local_6c);
          if (uVar7 == 0) goto LAB_0011709d;
          uVar11 = 0x327;
          do {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   uVar11,"ref_edge_rcm",(ulong)uVar7,"min");
            local_74 = uVar7;
LAB_0011709d:
            do {
              if (uVar7 != 0) {
                return local_74;
              }
              if (local_6c < 1) {
                uVar7 = pRVar2->n;
                if ((int)uVar7 <= (int)local_68) goto LAB_00117128;
                goto LAB_00116f28;
              }
              iVar1 = local_6c * 2;
              local_6c = local_6c + -1;
              uVar7 = ref_edge_rcm_queue(ref_edge_00,queue[iVar1 - 2],o2n,pRVar6,
                                         (REF_INT *)&local_68,queue,&local_6c);
            } while (uVar7 == 0);
            uVar11 = 0x330;
          } while( true );
        }
        pcVar13 = "malloc queue of REF_INT NULL";
        uVar11 = 0x31d;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar11
             ,"ref_edge_rcm",pcVar13);
      local_74 = 2;
    }
  }
  return local_74;
}

Assistant:

REF_FCN REF_STATUS ref_edge_rcm(REF_EDGE ref_edge, REF_INT **o2n_ptr,
                                REF_INT **n2o_ptr) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *o2n, *n2o, *queue;
  REF_INT min_degree, min_degree_node;
  REF_INT ndone, nqueue, node;

  *o2n_ptr = NULL;
  *n2o_ptr = NULL;
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc(n2o, ref_node_n(ref_node), REF_INT);
  ref_malloc(queue, 2 * ref_node_n(ref_node), REF_INT);

  ndone = 0;
  nqueue = 0;

  while (ndone < ref_node_n(ref_node)) {
    RSS(ref_edge_min_degree_node(ref_edge, o2n, &min_degree, &min_degree_node),
        "min degree node");
    RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                           &nqueue),
        "min");

    /* drain queue */
    while (nqueue > 0) {
      min_degree_node = queue[0 + 2 * (nqueue - 1)];
      min_degree = queue[1 + 2 * (nqueue - 1)];
      nqueue--;
      RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                             &nqueue),
          "min");
    }
  }

  REIS(ndone, ref_node_n(ref_node), "reordering done not original nodes");

  /* reverse with queue as temporary space */
  for (node = 0; node < ndone; node++) {
    queue[ndone - node - 1] = n2o[node];
  }
  /* copy back */
  for (node = 0; node < ndone; node++) {
    n2o[node] = queue[node];
  }
  ref_free(queue);

  /* set o2n to reverse */
  for (node = 0; node < ndone; node++) {
    o2n[n2o[node]] = node;
  }

  *o2n_ptr = o2n;
  *n2o_ptr = n2o;

  return REF_SUCCESS;
}